

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O2

void EDLines::EnumerateRectPoints
               (double sx,double sy,double ex,double ey,int *ptsx,int *ptsy,int *pNoPoints)

{
  double __x;
  double dVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  undefined4 unaff_EBP;
  uint uVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  long local_1c0;
  double vy [4];
  double vx [4];
  double local_78 [4];
  double local_58 [5];
  
  dVar20 = ex - sx;
  dVar18 = ey - sy;
  dVar19 = SQRT(dVar20 * dVar20 + dVar18 * dVar18);
  dVar20 = dVar20 / dVar19;
  dVar18 = dVar18 / dVar19;
  dVar18 = (dVar18 + dVar18) * 0.5;
  dVar19 = (dVar20 + dVar20) * 0.5;
  local_58[0] = sx - dVar18;
  local_58[1] = ex - dVar18;
  local_78[0] = sy + dVar19;
  local_78[1] = ey + dVar19;
  local_58[2] = ex + dVar18;
  local_58[3] = sx + dVar18;
  local_78[2] = ey - dVar19;
  local_78[3] = sy - dVar19;
  if ((ex <= sx) || (ey < sy)) {
    if ((sx < ex) || (ey <= sy)) {
      iVar2 = (sx <= ex || sy < ey) + 2;
    }
    else {
      iVar2 = 1;
    }
  }
  else {
    iVar2 = 0;
  }
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    uVar4 = (ulong)((iVar2 + (int)lVar3 & 3U) << 3);
    vx[lVar3] = *(double *)((long)local_58 + uVar4);
    vy[lVar3] = *(double *)((long)local_78 + uVar4);
  }
  dVar18 = ceil(vy[0]);
  dVar1 = vx[2];
  dVar20 = vx[1];
  iVar6 = (int)dVar18;
  dVar18 = vx[2] - vx[3];
  dVar19 = ceil(vx[0]);
  iVar2 = (int)dVar19 + -1;
  auVar17._4_4_ = -(uint)(0.01 < ABS(dVar20 - vx[2]));
  auVar17._0_4_ = -(uint)(0.01 < ABS(vx[0] - vx[1]));
  auVar17._8_4_ = -(uint)(0.01 < ABS(vx[0] - vx[3]));
  auVar17._12_4_ = -(uint)(0.01 < ABS(vx[3] - dVar1));
  uVar5 = movmskps(unaff_EBP,auVar17);
  uVar10 = (undefined4)((ulong)vy[3] >> 0x20);
  uVar14 = (undefined4)((ulong)vy[2] >> 0x20);
  uVar7 = SUB84(vy[3],0);
  uVar11 = uVar10;
  if (vy[2] <= vy[3]) {
    uVar7 = SUB84(vy[2],0);
    uVar11 = uVar14;
  }
  uVar12 = (undefined4)((ulong)vy[0] >> 0x20);
  uVar8 = SUB84(vy[0],0);
  uVar13 = uVar12;
  if (vy[3] <= vy[0]) {
    uVar8 = SUB84(vy[3],0);
    uVar13 = uVar10;
  }
  uVar15 = (undefined4)((ulong)vy[1] >> 0x20);
  uVar10 = SUB84(vy[2],0);
  if (vy[2] <= vy[1]) {
    uVar10 = SUB84(vy[1],0);
    uVar14 = uVar15;
  }
  uVar9 = SUB84(vy[1],0);
  if (vy[1] <= vy[0]) {
    uVar9 = SUB84(vy[0],0);
    uVar15 = uVar12;
  }
  dVar19 = -1.79769313486232e+308;
  local_1c0 = 0;
  do {
    iVar6 = iVar6 + 1;
    while( true ) {
      dVar16 = (double)iVar2;
      if (((double)iVar6 <= dVar19) || (dVar1 < dVar16)) goto LAB_00115b1f;
      dVar16 = (double)(iVar2 + 1);
      if (dVar1 < dVar16) break;
      if (vx[3] <= dVar16) {
        dVar19 = vy[2] - vy[3];
        if (((byte)((byte)uVar5 >> 3) != 0) ||
           (__x = (double)CONCAT44(uVar11,uVar7), dVar19 = ey - vy[3], vy[3] == vy[2])) {
          __x = ((dVar16 - vx[3]) * dVar19) / dVar18 + vy[3];
        }
      }
      else if (((uVar5 & 4) != 0) || (__x = (double)CONCAT44(uVar13,uVar8), vy[0] == vy[3])) {
        __x = ((dVar16 - vx[0]) * (vy[3] - vy[0])) / (vx[3] - vx[0]) + vy[0];
      }
      if (dVar20 <= dVar16) {
        if (((uVar5 & 2) != 0) || (dVar19 = (double)CONCAT44(uVar14,uVar10), vy[1] == vy[2])) {
          dVar19 = ((dVar16 - dVar20) * (vy[2] - vy[1])) / (dVar1 - dVar20) + vy[1];
        }
      }
      else if (((uVar5 & 1) != 0) || (dVar19 = (double)CONCAT44(uVar15,uVar9), vy[0] == vy[1])) {
        dVar19 = ((dVar16 - vx[0]) * (vy[1] - vy[0])) / (dVar20 - vx[0]) + vy[0];
      }
      dVar16 = ceil(__x);
      iVar6 = (int)dVar16;
      iVar2 = iVar2 + 1;
    }
    iVar2 = iVar2 + 1;
LAB_00115b1f:
    if (dVar1 < dVar16) {
      *pNoPoints = (int)local_1c0;
      return;
    }
    ptsx[local_1c0] = iVar2;
    ptsy[local_1c0] = iVar6;
    local_1c0 = local_1c0 + 1;
  } while( true );
}

Assistant:

void EDLines::EnumerateRectPoints(double sx, double sy, double ex, double ey, int ptsx[], int ptsy[], int * pNoPoints)
{
	double vxTmp[4], vyTmp[4];
	double vx[4], vy[4];
	int n, offset;

	double x1 = sx;
	double y1 = sy;
	double x2 = ex;
	double y2 = ey;
	double width = 2;

	double dx = x2 - x1;
	double dy = y2 - y1;
	double vLen = sqrt(dx*dx + dy*dy);

	// make unit vector
	dx = dx / vLen;
	dy = dy / vLen;

	/* build list of rectangle corners ordered
	in a circular way around the rectangle */
	vxTmp[0] = x1 - dy * width / 2.0;
	vyTmp[0] = y1 + dx * width / 2.0;
	vxTmp[1] = x2 - dy * width / 2.0;
	vyTmp[1] = y2 + dx * width / 2.0;
	vxTmp[2] = x2 + dy * width / 2.0;
	vyTmp[2] = y2 - dx * width / 2.0;
	vxTmp[3] = x1 + dy * width / 2.0;
	vyTmp[3] = y1 - dx * width / 2.0;

	/* compute rotation of index of corners needed so that the first
	point has the smaller x.

	if one side is vertical, thus two corners have the same smaller x
	value, the one with the largest y value is selected as the first.
	*/
	if (x1 < x2 && y1 <= y2) offset = 0;
	else if (x1 >= x2 && y1 < y2) offset = 1;
	else if (x1 > x2 && y1 >= y2) offset = 2;
	else                          offset = 3;

	/* apply rotation of index. */
	for (n = 0; n<4; n++) {
		vx[n] = vxTmp[(offset + n) % 4];
		vy[n] = vyTmp[(offset + n) % 4];
	} //end-for

	  /* Set a initial condition.

	  The values are set to values that will cause 'ri_inc' (that will
	  be called immediately) to initialize correctly the first 'column'
	  and compute the limits 'ys' and 'ye'.

	  'y' is set to the integer value of vy[0], the starting corner.

	  'ys' and 'ye' are set to very small values, so 'ri_inc' will
	  notice that it needs to start a new 'column'.

	  The smaller integer coordinate inside of the rectangle is
	  'ceil(vx[0])'. The current 'x' value is set to that value minus
	  one, so 'ri_inc' (that will increase x by one) will advance to
	  the first 'column'.
	  */
	int x = (int)ceil(vx[0]) - 1;
	int y = (int)ceil(vy[0]);
	double ys = -DBL_MAX, ye = -DBL_MAX;

	int noPoints = 0;
	while (1) {
		/* if not at end of exploration,
		increase y value for next pixel in the 'column' */
		y++;

		/* if the end of the current 'column' is reached,
		and it is not the end of exploration,
		advance to the next 'column' */
		while (y > ye && x <= vx[2]) {
			/* increase x, next 'column' */
			x++;

			/* if end of exploration, return */
			if (x > vx[2]) break;

			/* update lower y limit (start) for the new 'column'.

			We need to interpolate the y value that corresponds to the
			lower side of the rectangle. The first thing is to decide if
			the corresponding side is

			vx[0],vy[0] to vx[3],vy[3] or
			vx[3],vy[3] to vx[2],vy[2]

			Then, the side is interpolated for the x value of the
			'column'. But, if the side is vertical (as it could happen if
			the rectangle is vertical and we are dealing with the first
			or last 'columns') then we pick the lower value of the side
			by using 'inter_low'.
			*/
			if ((double)x < vx[3]) {
				/* interpolation */
				if (fabs(vx[0] - vx[3]) <= 0.01) {
					if (vy[0]<vy[3]) ys = vy[0];
					else if (vy[0]>vy[3]) ys = vy[3];
					else     ys = vy[0] + (x - vx[0]) * (vy[3] - vy[0]) / (vx[3] - vx[0]);
				}
				else
					ys = vy[0] + (x - vx[0]) * (vy[3] - vy[0]) / (vx[3] - vx[0]);

			}
			else {
				/* interpolation */
				if (fabs(vx[3] - vx[2]) <= 0.01) {
					if (vy[3]<vy[2]) ys = vy[3];
					else if (vy[3]>vy[2]) ys = vy[2];
					else     ys = vy[3] + (x - vx[3]) * (y2 - vy[3]) / (vx[2] - vx[3]);
				}
				else
					ys = vy[3] + (x - vx[3]) * (vy[2] - vy[3]) / (vx[2] - vx[3]);
			} //end-else

			  /* update upper y limit (end) for the new 'column'.

			  We need to interpolate the y value that corresponds to the
			  upper side of the rectangle. The first thing is to decide if
			  the corresponding side is

			  vx[0],vy[0] to vx[1],vy[1] or
			  vx[1],vy[1] to vx[2],vy[2]

			  Then, the side is interpolated for the x value of the
			  'column'. But, if the side is vertical (as it could happen if
			  the rectangle is vertical and we are dealing with the first
			  or last 'columns') then we pick the lower value of the side
			  by using 'inter_low'.
			  */
			if ((double)x < vx[1]) {
				/* interpolation */
				if (fabs(vx[0] - vx[1]) <= 0.01) {
					if (vy[0]<vy[1]) ye = vy[1];
					else if (vy[0]>vy[1]) ye = vy[0];
					else     ye = vy[0] + (x - vx[0]) * (vy[1] - vy[0]) / (vx[1] - vx[0]);
				}
				else
					ye = vy[0] + (x - vx[0]) * (vy[1] - vy[0]) / (vx[1] - vx[0]);

			}
			else {
				/* interpolation */
				if (fabs(vx[1] - vx[2]) <= 0.01) {
					if (vy[1]<vy[2]) ye = vy[2];
					else if (vy[1]>vy[2]) ye = vy[1];
					else     ye = vy[1] + (x - vx[1]) * (vy[2] - vy[1]) / (vx[2] - vx[1]);
				}
				else
					ye = vy[1] + (x - vx[1]) * (vy[2] - vy[1]) / (vx[2] - vx[1]);
			} //end-else

			  /* new y */
			y = (int)ceil(ys);
		} //end-while

		  // Are we done?
		if (x > vx[2]) break;

		ptsx[noPoints] = x;
		ptsy[noPoints] = y;
		noPoints++;
	} //end-while

	*pNoPoints = noPoints;
}